

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderCompilationCases.cpp
# Opt level: O0

int __thiscall
deqp::gles2::Performance::ShaderCompilerTextureCase::init
          (ShaderCompilerTextureCase *this,EVP_PKEY_CTX *ctx)

{
  code *pcVar1;
  int iVar2;
  deUint32 dVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  Texture2D *this_00;
  Texture2D *pTVar5;
  TextureFormat *format;
  PixelBufferAccess *access;
  EVP_PKEY_CTX *ctx_00;
  undefined1 local_74 [8];
  TextureFormatInfo fmtInfo;
  Texture2D *local_28;
  Texture2D *tex;
  long lStack_18;
  int i;
  Functions *gl;
  ShaderCompilerTextureCase *this_local;
  
  gl = (Functions *)this;
  pRVar4 = gles2::Context::getRenderContext
                     ((this->super_ShaderCompilerCase).super_TestCase.m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  lStack_18 = CONCAT44(extraout_var,iVar2);
  ctx_00 = (EVP_PKEY_CTX *)(long)this->m_numLookups;
  std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::reserve
            (&this->m_textures,(size_type)ctx_00);
  for (tex._4_4_ = 0; tex._4_4_ < this->m_numLookups; tex._4_4_ = tex._4_4_ + 1) {
    this_00 = (Texture2D *)operator_new(0x70);
    pRVar4 = gles2::Context::getRenderContext
                       ((this->super_ShaderCompilerCase).super_TestCase.m_context);
    glu::Texture2D::Texture2D(this_00,pRVar4,0x1907,0x1401,0x40,0x40);
    local_28 = this_00;
    pTVar5 = glu::Texture2D::getRefTexture(this_00);
    format = tcu::TextureLevelPyramid::getFormat(&pTVar5->super_TextureLevelPyramid);
    tcu::getTextureFormatInfo((TextureFormatInfo *)local_74,format);
    pTVar5 = glu::Texture2D::getRefTexture(local_28);
    tcu::Texture2D::allocLevel(pTVar5,0);
    pTVar5 = glu::Texture2D::getRefTexture(local_28);
    access = tcu::TextureLevelPyramid::getLevel(&pTVar5->super_TextureLevelPyramid,0);
    tcu::fillWithComponentGradients(access,(Vec4 *)local_74,(Vec4 *)(fmtInfo.valueMin.m_data + 2));
    (**(code **)(lStack_18 + 8))(tex._4_4_ + 0x84c0);
    pcVar1 = *(code **)(lStack_18 + 0xb8);
    dVar3 = glu::Texture2D::getGLTexture(local_28);
    (*pcVar1)(0xde1,dVar3);
    (**(code **)(lStack_18 + 0x1360))(0xde1,0x2801,0x2600);
    (**(code **)(lStack_18 + 0x1360))(0xde1,0x2800,0x2600);
    (**(code **)(lStack_18 + 0x1360))(0xde1,0x2802,0x812f);
    (**(code **)(lStack_18 + 0x1360))(0xde1,0x2803,0x812f);
    (*local_28->_vptr_Texture2D[2])();
    ctx_00 = (EVP_PKEY_CTX *)&local_28;
    std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::push_back
              (&this->m_textures,(value_type *)ctx_00);
  }
  iVar2 = ShaderCompilerCase::init(&this->super_ShaderCompilerCase,ctx_00);
  return iVar2;
}

Assistant:

void ShaderCompilerTextureCase::init (void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	// Setup texture.

	DE_ASSERT(m_textures.empty());

	m_textures.reserve(m_numLookups);

	for (int i = 0; i < m_numLookups; i++)
	{
		glu::Texture2D*			tex		= new glu::Texture2D(m_context.getRenderContext(), GL_RGB, GL_UNSIGNED_BYTE, TEXTURE_WIDTH, TEXTURE_HEIGHT);
		tcu::TextureFormatInfo	fmtInfo	= tcu::getTextureFormatInfo(tex->getRefTexture().getFormat());

		tex->getRefTexture().allocLevel(0);
		tcu::fillWithComponentGradients(tex->getRefTexture().getLevel(0), fmtInfo.valueMin, fmtInfo.valueMax);

		gl.activeTexture(GL_TEXTURE0 + i);
		gl.bindTexture(GL_TEXTURE_2D, tex->getGLTexture());
		gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
		gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);
		tex->upload();

		m_textures.push_back(tex);
	}

	ShaderCompilerCase::init();
}